

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

int get_mvpred_compound_var_cost
              (FULLPEL_MOTION_SEARCH_PARAMS *ms_params,FULLPEL_MV *this_mv,
              FULLPEL_MV_STATS *mv_stats)

{
  int iVar1;
  aom_variance_fn_ptr_t *paVar2;
  buf_2d *pbVar3;
  buf_2d *pbVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  uint uVar8;
  int iVar9;
  MV sub_this_mv;
  
  paVar2 = ms_params->vfp;
  pbVar3 = (ms_params->ms_buffers).ref;
  pbVar4 = (ms_params->ms_buffers).src;
  puVar5 = pbVar4->buf;
  iVar9 = pbVar4->stride;
  iVar1 = pbVar3->stride;
  puVar6 = (ms_params->ms_buffers).mask;
  puVar7 = (ms_params->ms_buffers).second_pred;
  if (puVar6 == (uint8_t *)0x0) {
    if (puVar7 == (uint8_t *)0x0) {
      uVar8 = (*paVar2->vf)(puVar5,iVar9,
                            pbVar3->buf + (long)this_mv->col + (long)this_mv->row * (long)iVar1,
                            iVar1,&mv_stats->sse);
    }
    else {
      uVar8 = (*paVar2->svaf)(pbVar3->buf + (long)this_mv->col + (long)this_mv->row * (long)iVar1,
                              iVar1,0,0,puVar5,iVar9,&mv_stats->sse,puVar7);
    }
  }
  else {
    uVar8 = (*paVar2->msvf)(pbVar3->buf + (long)this_mv->col + (long)this_mv->row * (long)iVar1,
                            iVar1,0,0,puVar5,iVar9,puVar7,puVar6,(ms_params->ms_buffers).mask_stride
                            ,(ms_params->ms_buffers).inv_mask,&mv_stats->sse);
  }
  mv_stats->distortion = uVar8;
  get_mv_from_fullmv(this_mv);
  iVar9 = mv_err_cost_(&sub_this_mv,&ms_params->mv_cost_params);
  mv_stats->err_cost = iVar9;
  return iVar9 + uVar8;
}

Assistant:

static inline int get_mvpred_compound_var_cost(
    const FULLPEL_MOTION_SEARCH_PARAMS *ms_params, const FULLPEL_MV *this_mv,
    FULLPEL_MV_STATS *mv_stats) {
  const aom_variance_fn_ptr_t *vfp = ms_params->vfp;
  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;
  const uint8_t *src_buf = src->buf;
  const int src_stride = src->stride;
  const int ref_stride = ref->stride;

  const uint8_t *mask = ms_params->ms_buffers.mask;
  const uint8_t *second_pred = ms_params->ms_buffers.second_pred;
  const int mask_stride = ms_params->ms_buffers.mask_stride;
  const int invert_mask = ms_params->ms_buffers.inv_mask;
  int bestsme;

  if (mask) {
    bestsme = vfp->msvf(get_buf_from_fullmv(ref, this_mv), ref_stride, 0, 0,
                        src_buf, src_stride, second_pred, mask, mask_stride,
                        invert_mask, &mv_stats->sse);
  } else if (second_pred) {
    bestsme = vfp->svaf(get_buf_from_fullmv(ref, this_mv), ref_stride, 0, 0,
                        src_buf, src_stride, &mv_stats->sse, second_pred);
  } else {
    bestsme = vfp->vf(src_buf, src_stride, get_buf_from_fullmv(ref, this_mv),
                      ref_stride, &mv_stats->sse);
  }
  mv_stats->distortion = bestsme;

  const MV sub_this_mv = get_mv_from_fullmv(this_mv);
  mv_stats->err_cost = mv_err_cost_(&sub_this_mv, &ms_params->mv_cost_params);
  bestsme += mv_stats->err_cost;

  return bestsme;
}